

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

Statement *
slang::ast::BlockStatement::fromSyntax
          (Compilation *comp,BlockStatementSyntax *syntax,ASTContext *sourceCtx,
          StatementContext *stmtCtx,bool addInitializers)

{
  size_t sVar1;
  pointer ppSVar2;
  SyntaxKind *pSVar3;
  Compilation *this;
  bool bVar4;
  bool bVar5;
  StatementBlockKind SVar6;
  int iVar7;
  ProceduralBlockSymbol *pPVar8;
  Diagnostic *this_00;
  InvalidStatement *pIVar9;
  undefined4 extraout_var;
  BlockStatement *pBVar10;
  underlying_type uVar11;
  long lVar12;
  SourceRange SVar13;
  string_view arg;
  ASTContext context;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  BlockStatement *local_c8;
  ulong local_c0;
  BlockStatementSyntax *local_b8;
  Compilation *local_b0;
  ASTContext local_a8;
  undefined1 local_70 [64];
  
  local_a8.assertionInstance = sourceCtx->assertionInstance;
  local_a8.scope.ptr = (sourceCtx->scope).ptr;
  local_a8.lookupIndex = sourceCtx->lookupIndex;
  local_a8._12_4_ = *(undefined4 *)&sourceCtx->field_0xc;
  local_a8.flags.m_bits = (sourceCtx->flags).m_bits;
  local_a8.instanceOrProc = sourceCtx->instanceOrProc;
  local_a8.firstTempVar = sourceCtx->firstTempVar;
  local_a8.randomizeDetails = sourceCtx->randomizeDetails;
  SVar6 = SemanticFacts::getStatementBlockKind(syntax);
  if ((local_a8.flags.m_bits & 0x1800) == 0) {
    if (SVar6 == Sequential) {
      uVar11 = (stmtCtx->flags).m_bits;
      goto LAB_002f2066;
    }
    bVar4 = ASTContext::inAlwaysCombLatch(&local_a8);
    if (bVar4) {
      pPVar8 = ASTContext::getProceduralBlock(&local_a8);
      SVar13 = parsing::Token::range(&syntax->begin);
      this_00 = ASTContext::addDiag(&local_a8,(DiagCode)0x1c0008,SVar13);
      arg = SemanticFacts::getProcedureKindStr(pPVar8->procedureKind);
      Diagnostic::operator<<(this_00,arg);
      goto LAB_002f2007;
    }
LAB_002f203b:
    uVar11 = (stmtCtx->flags).m_bits;
  }
  else {
    if (SVar6 - JoinAll < 2) {
      SVar13 = parsing::Token::range(&syntax->end);
      ASTContext::addDiag(&local_a8,(DiagCode)0x4d0008,SVar13);
LAB_002f2007:
      local_70._0_8_ = (Statement *)0x0;
      pIVar9 = BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                         (&comp->super_BumpAllocator,(Statement **)local_70);
      return &pIVar9->super_Statement;
    }
    if (SVar6 == JoinNone) {
      local_a8.flags.m_bits = local_a8.flags.m_bits & 0x1fffffffe7ff;
      goto LAB_002f203b;
    }
    uVar11 = (stmtCtx->flags).m_bits;
    if (SVar6 == Sequential) goto LAB_002f2066;
  }
  (stmtCtx->flags).m_bits = uVar11 & 0x14 | 2;
LAB_002f2066:
  local_70._0_8_ = local_70 + 0x18;
  local_70._8_8_ = 0;
  local_70._16_8_ = 5;
  if (addInitializers) {
    Statement::bindScopeInitializers
              (&local_a8,(SmallVectorBase<const_slang::ast::Statement_*> *)local_70);
  }
  if ((SVar6 & ~JoinAll) == JoinAny) {
    local_a8.flags.m_bits = local_a8.flags.m_bits | 0x40000000000;
  }
  sVar1 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  local_c0 = (ulong)SVar6;
  local_b8 = syntax;
  local_b0 = comp;
  if (sVar1 == 0) {
    bVar4 = false;
  }
  else {
    ppSVar2 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>._M_ptr
    ;
    lVar12 = 0;
    bVar4 = false;
    do {
      pSVar3 = *(SyntaxKind **)((long)ppSVar2 + lVar12);
      bVar5 = slang::syntax::StatementSyntax::isKind(*pSVar3);
      if (bVar5) {
        iVar7 = Statement::bind((int)pSVar3,(sockaddr *)&local_a8,(socklen_t)stmtCtx);
        local_c8 = (BlockStatement *)CONCAT44(extraout_var,iVar7);
        SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                  ((SmallVectorBase<slang::ast::Statement_const*> *)local_70,(Statement **)&local_c8
                  );
        bVar4 = (bool)(bVar4 | (((BlockStatement *)CONCAT44(extraout_var,iVar7))->super_Statement).
                               kind == Invalid);
      }
      lVar12 = lVar12 + 8;
    } while (sVar1 << 3 != lVar12);
  }
  this = local_b0;
  pBVar10 = createBlockStatement
                      (local_b0,(SmallVectorBase<const_slang::ast::Statement_*> *)local_70,
                       (SyntaxNode *)local_b8,(StatementBlockKind)local_c0);
  if (bVar4) {
    local_c8 = pBVar10;
    pBVar10 = (BlockStatement *)
              BumpAllocator::emplace<slang::ast::InvalidStatement,slang::ast::Statement_const*&>
                        (&this->super_BumpAllocator,(Statement **)&local_c8);
  }
  if ((Statement *)local_70._0_8_ != (Statement *)(local_70 + 0x18)) {
    operator_delete((void *)local_70._0_8_);
  }
  (stmtCtx->flags).m_bits = uVar11 & 0xb | (stmtCtx->flags).m_bits & 0x14;
  return &pBVar10->super_Statement;
}

Assistant:

Statement& BlockStatement::fromSyntax(Compilation& comp, const BlockStatementSyntax& syntax,
                                      const ASTContext& sourceCtx, StatementContext& stmtCtx,
                                      bool addInitializers) {
    ASTContext context = sourceCtx;
    auto blockKind = SemanticFacts::getStatementBlockKind(syntax);
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final)) {
        if (blockKind == StatementBlockKind::JoinAll || blockKind == StatementBlockKind::JoinAny) {
            context.addDiag(diag::TimingInFuncNotAllowed, syntax.end.range());
            return badStmt(comp, nullptr);
        }
        else if (blockKind == StatementBlockKind::JoinNone) {
            // The "function body" flag does not propagate through fork-join_none
            // blocks, as all statements are allowed in those.
            context.flags &= ~ASTFlags::Function & ~ASTFlags::Final;
        }
    }
    else if (blockKind != StatementBlockKind::Sequential && context.inAlwaysCombLatch()) {
        auto proc = context.getProceduralBlock();
        SLANG_ASSERT(proc);
        context.addDiag(diag::ForkJoinAlwaysComb, syntax.begin.range())
            << SemanticFacts::getProcedureKindStr(proc->procedureKind);
        return badStmt(comp, nullptr);
    }

    // When entering a fork-join we clear any active loop flags, since the new
    // forked processes are effectively not in that loop (and statements like
    // continue and break do not apply to the outer loop).
    auto guard = ScopeGuard([&stmtCtx, savedFlags = stmtCtx.flags] {
        const auto savableFlags = StatementFlags::InLoop | StatementFlags::InForLoop |
                                  StatementFlags::InForkJoin;
        stmtCtx.flags &= ~savableFlags;
        stmtCtx.flags |= savedFlags & savableFlags;
    });

    if (blockKind != StatementBlockKind::Sequential) {
        stmtCtx.flags |= StatementFlags::InForkJoin;
        stmtCtx.flags &= ~(StatementFlags::InLoop | StatementFlags::InForLoop);
    }

    bool anyBad = false;
    SmallVector<const Statement*> buffer;

    if (addInitializers)
        bindScopeInitializers(context, buffer);

    if (blockKind == StatementBlockKind::JoinAny || blockKind == StatementBlockKind::JoinNone)
        context.flags |= ASTFlags::ForkJoinAnyNone;

    for (auto item : syntax.items) {
        if (StatementSyntax::isKind(item->kind)) {
            auto& stmt = Statement::bind(item->as<StatementSyntax>(), context, stmtCtx,
                                         /* inList */ true);
            buffer.push_back(&stmt);
            anyBad |= stmt.bad();
        }
    }

    auto result = createBlockStatement(comp, buffer, syntax, blockKind);
    if (anyBad)
        return badStmt(comp, result);

    return *result;
}